

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_unix.cpp
# Opt level: O2

bool __thiscall QProcessPrivate::waitForBytesWritten(QProcessPrivate *this,QDeadlineTimer *deadline)

{
  QRingBuffer *pQVar1;
  bool bVar2;
  int iVar3;
  undefined8 in_RCX;
  nfds_t __nfds;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_68;
  QProcessPoller local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    pQVar1 = (this->super_QIODevicePrivate).writeBuffer.m_buf;
    if ((pQVar1 == (QRingBuffer *)0x0) || (pQVar1->bufferSize == 0)) goto LAB_003d4008;
    local_48.pfds[2] = (pollfd)&DAT_aaaaaaaaaaaaaaaa;
    local_48.pfds[3] = (pollfd)&DAT_aaaaaaaaaaaaaaaa;
    local_48.pfds[0] = (pollfd)&DAT_aaaaaaaaaaaaaaaa;
    local_48.pfds[1] = (pollfd)&DAT_aaaaaaaaaaaaaaaa;
    anon_unknown.dwarf_133c8f4::QProcessPoller::QProcessPoller(&local_48,this);
    iVar3 = anon_unknown.dwarf_133c8f4::QProcessPoller::poll
                      (&local_48,(pollfd *)deadline,__nfds,(int)in_RCX);
    if (iVar3 < 0) goto LAB_003d4008;
    if (iVar3 == 0) {
      local_68.d = (Data *)0x0;
      local_68.ptr = (char16_t *)0x0;
      local_68.size = 0;
      setError(this,Timedout,(QString *)&local_68);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
      goto LAB_003d4008;
    }
    if ((-1 < local_48.pfds[0].fd) && (((ulong)local_48.pfds[0] & 0x3c000000000000) != 0)) {
      bVar2 = _q_canWrite(this);
      goto LAB_003d400a;
    }
    if ((-1 < local_48.pfds[1].fd) && (((ulong)local_48.pfds[1] & 0x39000000000000) != 0)) {
      _q_canReadStandardOutput(this);
    }
    if ((-1 < local_48.pfds[2].fd) && (((ulong)local_48.pfds[2] & 0x39000000000000) != 0)) {
      _q_canReadStandardError(this);
    }
    if (this->processState == '\0') goto LAB_003d4008;
  } while ((local_48.pfds[3].fd < 0) || (((ulong)local_48.pfds[3] & 0x39000000000000) == 0));
  processFinished(this);
LAB_003d4008:
  bVar2 = false;
LAB_003d400a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QProcessPrivate::waitForBytesWritten(const QDeadlineTimer &deadline)
{
#if defined (QPROCESS_DEBUG)
    qDebug("QProcessPrivate::waitForBytesWritten(%lld)", deadline.remainingTime());
#endif

    while (!writeBuffer.isEmpty()) {
        QProcessPoller poller(*this);

        int ret = poller.poll(deadline);

        if (ret < 0) {
            break;
        }

        if (ret == 0) {
            setError(QProcess::Timedout);
            return false;
        }

        if (qt_pollfd_check(poller.stdinPipe(), POLLOUT))
            return _q_canWrite();

        if (qt_pollfd_check(poller.stdoutPipe(), POLLIN))
            _q_canReadStandardOutput();

        if (qt_pollfd_check(poller.stderrPipe(), POLLIN))
            _q_canReadStandardError();

        // Signals triggered by I/O may have stopped this process:
        if (processState == QProcess::NotRunning)
            return false;

        if (qt_pollfd_check(poller.forkfd(), POLLIN)) {
            processFinished();
            return false;
        }
    }

    return false;
}